

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O1

int __thiscall TString::Find(TString *this,char c,int cStartPos,bool fIgnoreCase)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  
  pcVar2 = this->myString + cStartPos;
  uVar3 = cStartPos - 1;
  do {
    cVar1 = *pcVar2;
    uVar3 = uVar3 + 1;
    if (cVar1 == '\0') break;
    pcVar2 = pcVar2 + 1;
  } while (cVar1 != c);
  return -(uint)(cVar1 == '\0') | uVar3;
}

Assistant:

signed int TString::Find(const char c, int cStartPos, bool fIgnoreCase)
{
	char *cptr = myString + cStartPos;
	while(*cptr != '\0' && *cptr != c)
		cptr++;
	if(*cptr == '\0')
		return -1;
	return (cptr - myString);
}